

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix-test.cc
# Opt level: O1

void __thiscall SuffixTest_VisitSuffixValues_Test::TestBody(SuffixTest_VisitSuffixValues_Test *this)

{
  FunctionMocker<void_(int,_double)> *pFVar1;
  linked_ptr_internal *plVar2;
  _func_int **pp_Var3;
  SuffixImpl *pSVar4;
  undefined8 *puVar5;
  MockSpec<void_(int,_int)> *pMVar6;
  MockSpec<void_(int,_double)> *pMVar7;
  char **ppcVar8;
  SuffixSet *this_00;
  StringRef name;
  StringRef name_00;
  BasicMutSuffix<int> is;
  MockValueVisitor v;
  Matcher<int> local_160;
  Matcher<double> local_148;
  MockValueVisitor local_130;
  
  this_00 = &(this->super_SuffixTest).suffixes_;
  ppcVar8 = &local_130.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.
             super_UntypedFunctionMockerBase.name_;
  local_130.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.
  super_UntypedFunctionMockerBase.mock_obj_ = (void *)0x0;
  local_130.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.
  super_UntypedFunctionMockerBase.name_._0_1_ = 0;
  name.size_ = 2;
  name.data_ = "is";
  local_130.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase = (_func_int **)ppcVar8;
  pSVar4 = mp::BasicSuffixSet<std::allocator<char>_>::DoAdd
                     (this_00,name,0,3,(SuffixTable *)&local_130);
  puVar5 = (undefined8 *)operator_new(0xc);
  *(undefined4 *)(puVar5 + 1) = 0;
  *puVar5 = 0;
  (pSVar4->field_3).values = puVar5;
  local_160.super_MatcherBase<int>._vptr_MatcherBase = (_func_int **)pSVar4;
  if (local_130.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.
      super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase != (_func_int **)ppcVar8) {
    operator_delete(local_130.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.
                    super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase,
                    CONCAT71(local_130.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.
                             super_UntypedFunctionMockerBase.name_._1_7_,
                             local_130.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.
                             super_UntypedFunctionMockerBase.name_._0_1_) + 1);
  }
  mp::BasicMutSuffix<int>::set_value((BasicMutSuffix<int> *)&local_160,0,0x2a);
  mp::BasicMutSuffix<int>::set_value((BasicMutSuffix<int> *)&local_160,1,0);
  mp::BasicMutSuffix<int>::set_value((BasicMutSuffix<int> *)&local_160,2,0xb);
  pp_Var3 = local_160.super_MatcherBase<int>._vptr_MatcherBase;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&local_130);
  local_130.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>_>.
  super__Tuple_impl<1UL,_testing::Matcher<int>_>.super__Head_base<1UL,_testing::Matcher<int>,_false>
  ._M_head_impl.super_MatcherBase<int>.impl_.link_.next_ =
       (linked_ptr_internal *)
       ((long)&local_130.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.current_spec_.
               matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>_> +
       0x10);
  local_130.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>_>.
  super__Tuple_impl<1UL,_testing::Matcher<int>_>.super__Head_base<1UL,_testing::Matcher<int>,_false>
  ._M_head_impl.super_MatcherBase<int>.impl_.value_ = (MatcherInterface<int> *)0x0;
  local_130.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>_>.
  super__Tuple_impl<1UL,_testing::Matcher<int>_>.super__Head_base<1UL,_testing::Matcher<int>,_false>
  ._M_head_impl.super_MatcherBase<int>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00172e50;
  local_130.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>_>.
  super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.impl_.
  value_ = (MatcherInterface<int> *)0x0;
  local_130.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>_>.
  super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.impl_.
  link_.next_ = (linked_ptr_internal *)
                ((long)&local_130.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.
                        current_spec_.matchers_.
                        super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>_> + 0x28
                );
  local_130.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>_>.
  super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00172e50;
  local_130.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_00172d80;
  pFVar1 = &local_130.gmock2_Visit_147;
  local_130.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.current_spec_.
  function_mocker_ = (FunctionMockerBase<void_(int,_int)> *)&local_130;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)pFVar1);
  plVar2 = (linked_ptr_internal *)
           ((long)&local_130.gmock2_Visit_147.super_FunctionMockerBase<void_(int,_double)>.
                   current_spec_.matchers_.
                   super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<double>_> + 0x10);
  local_130.gmock2_Visit_147.super_FunctionMockerBase<void_(int,_double)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Tuple_impl<1UL,_testing::Matcher<double>_>.
  super__Head_base<1UL,_testing::Matcher<double>,_false>._M_head_impl.super_MatcherBase<double>.
  impl_.value_ = (MatcherInterface<double> *)0x0;
  local_130.gmock2_Visit_147.super_FunctionMockerBase<void_(int,_double)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Tuple_impl<1UL,_testing::Matcher<double>_>.
  super__Head_base<1UL,_testing::Matcher<double>,_false>._M_head_impl.super_MatcherBase<double>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00173058;
  local_130.gmock2_Visit_147.super_FunctionMockerBase<void_(int,_double)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.impl_.
  value_ = (MatcherInterface<int> *)0x0;
  local_130.gmock2_Visit_147.super_FunctionMockerBase<void_(int,_double)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.impl_.
  link_.next_ = (linked_ptr_internal *)
                ((long)&local_130.gmock2_Visit_147.super_FunctionMockerBase<void_(int,_double)>.
                        current_spec_.matchers_.
                        super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<double>_> +
                0x28);
  local_130.gmock2_Visit_147.super_FunctionMockerBase<void_(int,_double)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00172e50;
  local_130.gmock2_Visit_147.super_FunctionMockerBase<void_(int,_double)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_00172f88;
  local_130.gmock2_Visit_147.super_FunctionMockerBase<void_(int,_double)>.current_spec_.
  function_mocker_ = &pFVar1->super_FunctionMockerBase<void_(int,_double)>;
  local_130.gmock2_Visit_147.super_FunctionMockerBase<void_(int,_double)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Tuple_impl<1UL,_testing::Matcher<double>_>.
  super__Head_base<1UL,_testing::Matcher<double>,_false>._M_head_impl.super_MatcherBase<double>.
  impl_.link_.next_ = plVar2;
  testing::Matcher<int>::Matcher(&local_160,0);
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_148,0x2a);
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)&local_130,&local_130);
  pMVar6 = testing::internal::FunctionMocker<void_(int,_int)>::With
                     (&local_130.gmock2_Visit_146,&local_160,(Matcher<int> *)&local_148);
  testing::internal::MockSpec<void_(int,_int)>::InternalExpectedAt
            (pMVar6,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/suffix-test.cc",0xb7,
             "v","Visit(0, Matcher<int>(42))");
  local_148.super_MatcherBase<double>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00172e98;
  testing::internal::linked_ptr<const_testing::MatcherInterface<int>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<int>_> *)
             &local_148.super_MatcherBase<double>.impl_);
  local_160.super_MatcherBase<int>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00172e98;
  testing::internal::linked_ptr<const_testing::MatcherInterface<int>_>::~linked_ptr
            (&local_160.super_MatcherBase<int>.impl_);
  testing::Matcher<int>::Matcher(&local_160,2);
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_148,0xb);
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)&local_130,&local_130);
  pMVar6 = testing::internal::FunctionMocker<void_(int,_int)>::With
                     (&local_130.gmock2_Visit_146,&local_160,(Matcher<int> *)&local_148);
  testing::internal::MockSpec<void_(int,_int)>::InternalExpectedAt
            (pMVar6,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/suffix-test.cc",0xb8,
             "v","Visit(2, Matcher<int>(11))");
  local_148.super_MatcherBase<double>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00172e98;
  testing::internal::linked_ptr<const_testing::MatcherInterface<int>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<int>_> *)
             &local_148.super_MatcherBase<double>.impl_);
  local_160.super_MatcherBase<int>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00172e98;
  testing::internal::linked_ptr<const_testing::MatcherInterface<int>_>::~linked_ptr
            (&local_160.super_MatcherBase<int>.impl_);
  local_160.super_MatcherBase<int>._vptr_MatcherBase = (_func_int **)(SuffixImpl *)0x0;
  if ((*(int *)((long)pp_Var3 + 0x10) & 4U) == 0) {
    local_160.super_MatcherBase<int>._vptr_MatcherBase = pp_Var3;
  }
  if ((SuffixImpl *)local_160.super_MatcherBase<int>._vptr_MatcherBase == (SuffixImpl *)0x0) {
    local_148.super_MatcherBase<double>._vptr_MatcherBase = pp_Var3;
    if ((*(int *)((long)pp_Var3 + 0x10) & 4U) == 0) {
      local_148.super_MatcherBase<double>._vptr_MatcherBase = (_func_int **)(SuffixImpl *)0x0;
    }
    mp::BasicSuffix<double>::VisitValues<MockValueVisitor>
              ((BasicSuffix<double> *)&local_148,&local_130);
  }
  else {
    mp::BasicSuffix<int>::VisitValues<MockValueVisitor>((BasicSuffix<int> *)&local_160,&local_130);
  }
  ppcVar8 = &local_130.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.
             super_UntypedFunctionMockerBase.name_;
  testing::internal::FunctionMockerBase<void_(int,_double)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(int,_double)>);
  testing::internal::FunctionMockerBase<void_(int,_int)>::~FunctionMockerBase
            ((FunctionMockerBase<void_(int,_int)> *)&local_130);
  local_130.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.
  super_UntypedFunctionMockerBase.mock_obj_ = (void *)0x0;
  local_130.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.
  super_UntypedFunctionMockerBase.name_._0_1_ = 0;
  name_00.size_ = 2;
  name_00.data_ = "ds";
  local_130.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase = (_func_int **)ppcVar8;
  pSVar4 = mp::BasicSuffixSet<std::allocator<char>_>::DoAdd
                     (this_00,name_00,4,3,(SuffixTable *)&local_130);
  puVar5 = (undefined8 *)operator_new(0x18);
  *puVar5 = 0;
  puVar5[1] = 0;
  puVar5[2] = 0;
  (pSVar4->field_3).values = puVar5;
  local_160.super_MatcherBase<int>._vptr_MatcherBase = (_func_int **)pSVar4;
  if (local_130.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.
      super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase != (_func_int **)ppcVar8) {
    operator_delete(local_130.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.
                    super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase,
                    CONCAT71(local_130.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.
                             super_UntypedFunctionMockerBase.name_._1_7_,
                             local_130.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.
                             super_UntypedFunctionMockerBase.name_._0_1_) + 1);
  }
  mp::BasicMutSuffix<double>::set_value((BasicMutSuffix<double> *)&local_160,0,4.2);
  mp::BasicMutSuffix<double>::set_value((BasicMutSuffix<double> *)&local_160,1,0.0);
  mp::BasicMutSuffix<double>::set_value((BasicMutSuffix<double> *)&local_160,2,1.1);
  pp_Var3 = local_160.super_MatcherBase<int>._vptr_MatcherBase;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&local_130);
  local_130.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>_>.
  super__Tuple_impl<1UL,_testing::Matcher<int>_>.super__Head_base<1UL,_testing::Matcher<int>,_false>
  ._M_head_impl.super_MatcherBase<int>.impl_.value_ = (MatcherInterface<int> *)0x0;
  local_130.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>_>.
  super__Tuple_impl<1UL,_testing::Matcher<int>_>.super__Head_base<1UL,_testing::Matcher<int>,_false>
  ._M_head_impl.super_MatcherBase<int>.impl_.link_.next_ =
       (linked_ptr_internal *)
       ((long)&local_130.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.current_spec_.
               matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>_> +
       0x10);
  local_130.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>_>.
  super__Tuple_impl<1UL,_testing::Matcher<int>_>.super__Head_base<1UL,_testing::Matcher<int>,_false>
  ._M_head_impl.super_MatcherBase<int>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00172e50;
  local_130.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>_>.
  super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.impl_.
  value_ = (MatcherInterface<int> *)0x0;
  local_130.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>_>.
  super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.impl_.
  link_.next_ = (linked_ptr_internal *)
                ((long)&local_130.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.
                        current_spec_.matchers_.
                        super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>_> + 0x28
                );
  local_130.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>_>.
  super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00172e50;
  local_130.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_00172d80;
  pFVar1 = &local_130.gmock2_Visit_147;
  local_130.gmock2_Visit_146.super_FunctionMockerBase<void_(int,_int)>.current_spec_.
  function_mocker_ = (FunctionMockerBase<void_(int,_int)> *)&local_130;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)pFVar1);
  local_130.gmock2_Visit_147.super_FunctionMockerBase<void_(int,_double)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.impl_.
  link_.next_ = (linked_ptr_internal *)
                ((long)&local_130.gmock2_Visit_147.super_FunctionMockerBase<void_(int,_double)>.
                        current_spec_.matchers_.
                        super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<double>_> +
                0x28);
  local_130.gmock2_Visit_147.super_FunctionMockerBase<void_(int,_double)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Tuple_impl<1UL,_testing::Matcher<double>_>.
  super__Head_base<1UL,_testing::Matcher<double>,_false>._M_head_impl.super_MatcherBase<double>.
  impl_.value_ = (MatcherInterface<double> *)0x0;
  local_130.gmock2_Visit_147.super_FunctionMockerBase<void_(int,_double)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Tuple_impl<1UL,_testing::Matcher<double>_>.
  super__Head_base<1UL,_testing::Matcher<double>,_false>._M_head_impl.super_MatcherBase<double>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00173058;
  local_130.gmock2_Visit_147.super_FunctionMockerBase<void_(int,_double)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.impl_.
  value_ = (MatcherInterface<int> *)0x0;
  local_130.gmock2_Visit_147.super_FunctionMockerBase<void_(int,_double)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00172e50;
  local_130.gmock2_Visit_147.super_FunctionMockerBase<void_(int,_double)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_00172f88;
  local_130.gmock2_Visit_147.super_FunctionMockerBase<void_(int,_double)>.current_spec_.
  function_mocker_ = &pFVar1->super_FunctionMockerBase<void_(int,_double)>;
  local_130.gmock2_Visit_147.super_FunctionMockerBase<void_(int,_double)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Tuple_impl<1UL,_testing::Matcher<double>_>.
  super__Head_base<1UL,_testing::Matcher<double>,_false>._M_head_impl.super_MatcherBase<double>.
  impl_.link_.next_ = plVar2;
  testing::Matcher<int>::Matcher(&local_160,0);
  testing::Matcher<double>::Matcher(&local_148,4.2);
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_130);
  pMVar7 = testing::internal::FunctionMocker<void_(int,_double)>::With(pFVar1,&local_160,&local_148)
  ;
  testing::internal::MockSpec<void_(int,_double)>::InternalExpectedAt
            (pMVar7,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/suffix-test.cc",0xc4,
             "v","Visit(0, Matcher<double>(4.2))");
  local_148.super_MatcherBase<double>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001730a0;
  testing::internal::linked_ptr<const_testing::MatcherInterface<double>_>::~linked_ptr
            (&local_148.super_MatcherBase<double>.impl_);
  local_160.super_MatcherBase<int>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00172e98;
  testing::internal::linked_ptr<const_testing::MatcherInterface<int>_>::~linked_ptr
            (&local_160.super_MatcherBase<int>.impl_);
  testing::Matcher<int>::Matcher(&local_160,2);
  testing::Matcher<double>::Matcher(&local_148,1.1);
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pFVar1,&local_130);
  pMVar7 = testing::internal::FunctionMocker<void_(int,_double)>::With(pFVar1,&local_160,&local_148)
  ;
  testing::internal::MockSpec<void_(int,_double)>::InternalExpectedAt
            (pMVar7,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/suffix-test.cc",0xc5,
             "v","Visit(2, Matcher<double>(1.1))");
  local_148.super_MatcherBase<double>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001730a0;
  testing::internal::linked_ptr<const_testing::MatcherInterface<double>_>::~linked_ptr
            (&local_148.super_MatcherBase<double>.impl_);
  local_160.super_MatcherBase<int>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00172e98;
  testing::internal::linked_ptr<const_testing::MatcherInterface<int>_>::~linked_ptr
            (&local_160.super_MatcherBase<int>.impl_);
  local_160.super_MatcherBase<int>._vptr_MatcherBase = (_func_int **)(SuffixImpl *)0x0;
  if ((*(int *)((long)pp_Var3 + 0x10) & 4U) == 0) {
    local_160.super_MatcherBase<int>._vptr_MatcherBase = pp_Var3;
  }
  if ((SuffixImpl *)local_160.super_MatcherBase<int>._vptr_MatcherBase == (SuffixImpl *)0x0) {
    local_148.super_MatcherBase<double>._vptr_MatcherBase = pp_Var3;
    if ((*(int *)((long)pp_Var3 + 0x10) & 4U) == 0) {
      local_148.super_MatcherBase<double>._vptr_MatcherBase = (_func_int **)(SuffixImpl *)0x0;
    }
    mp::BasicSuffix<double>::VisitValues<MockValueVisitor>
              ((BasicSuffix<double> *)&local_148,&local_130);
  }
  else {
    mp::BasicSuffix<int>::VisitValues<MockValueVisitor>((BasicSuffix<int> *)&local_160,&local_130);
  }
  testing::internal::FunctionMockerBase<void_(int,_double)>::~FunctionMockerBase
            (&pFVar1->super_FunctionMockerBase<void_(int,_double)>);
  testing::internal::FunctionMockerBase<void_(int,_int)>::~FunctionMockerBase
            ((FunctionMockerBase<void_(int,_int)> *)&local_130);
  return;
}

Assistant:

TEST_F(SuffixTest, VisitSuffixValues) {
  Suffix s;
  {
    auto is = suffixes_.Add<int>("is", 0, 3);
    is.set_value(0, 42);
    is.set_value(1, 0);
    is.set_value(2, 11);
    s = is;
  }
  {
    MockValueVisitor v;
    EXPECT_CALL(v, Visit(0, Matcher<int>(42)));
    EXPECT_CALL(v, Visit(2, Matcher<int>(11)));
    s.VisitValues(v);
  }
  {
    auto ds = suffixes_.Add<double>("ds", 0, 3);
    ds.set_value(0, 4.2);
    ds.set_value(1, 0);
    ds.set_value(2, 1.1);
    s = ds;
  }
  {
    MockValueVisitor v;
    EXPECT_CALL(v, Visit(0, Matcher<double>(4.2)));
    EXPECT_CALL(v, Visit(2, Matcher<double>(1.1)));
    s.VisitValues(v);
  }
}